

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaDeviceIndex Pa_GetDefaultInputDevice(void)

{
  PaDeviceIndex PVar1;
  
  PVar1 = -1;
  if (((initializationCount_ != 0) && (-1 < (long)defaultHostApiIndex_)) &&
     (defaultHostApiIndex_ < hostApisCount_)) {
    PVar1 = (hostApis_[defaultHostApiIndex_]->info).defaultInputDevice;
  }
  return PVar1;
}

Assistant:

PaDeviceIndex Pa_GetDefaultInputDevice( void )
{
    PaHostApiIndex hostApi;
    PaDeviceIndex result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultInputDevice" );

    hostApi = Pa_GetDefaultHostApi();
    if( hostApi < 0 )
    {
        result = paNoDevice;
    }
    else
    {
        result = hostApis_[hostApi]->info.defaultInputDevice;
    }

    PA_LOGAPI_EXIT_T( "Pa_GetDefaultInputDevice", "PaDeviceIndex: %d", result );

    return result;
}